

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UChar * toUpperCase(UChar *source,int32_t len,char *locale)

{
  UBool UVar1;
  int32_t destCapacity;
  int local_34;
  UErrorCode local_2c;
  int32_t destLen;
  UErrorCode ec;
  UChar *dest;
  char *locale_local;
  UChar *pUStack_10;
  int32_t len_local;
  UChar *source_local;
  
  _destLen = (UChar *)0x0;
  local_2c = U_ZERO_ERROR;
  dest = (UChar *)locale;
  locale_local._4_4_ = len;
  pUStack_10 = source;
  destCapacity = u_strToUpper_63((UChar *)0x0,0,source,len,locale,&local_2c);
  local_2c = U_ZERO_ERROR;
  local_34 = destCapacity;
  if (destCapacity < locale_local._4_4_) {
    local_34 = locale_local._4_4_;
  }
  _destLen = (UChar *)uprv_malloc_63((long)local_34 << 1);
  u_strToUpper_63(_destLen,destCapacity,pUStack_10,locale_local._4_4_,(char *)dest,&local_2c);
  UVar1 = U_FAILURE(local_2c);
  if (UVar1 != '\0') {
    u_memcpy_63(_destLen,pUStack_10,locale_local._4_4_);
  }
  return _destLen;
}

Assistant:

static UChar* 
toUpperCase(const UChar* source, int32_t len, const char* locale) {
    UChar* dest = NULL;
    UErrorCode ec = U_ZERO_ERROR;
    int32_t destLen = u_strToUpper(dest, 0, source, len, locale, &ec);

    ec = U_ZERO_ERROR;
    dest = (UChar*)uprv_malloc(sizeof(UChar) * MAX(destLen, len));
    u_strToUpper(dest, destLen, source, len, locale, &ec);
    if (U_FAILURE(ec)) {
        u_memcpy(dest, source, len);
    } 
    return dest;
}